

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

FILE * testing::internal::OpenFileForWriting(string *output_file)

{
  string *pathname;
  pointer pcVar1;
  bool bVar2;
  FILE *pFVar3;
  ostream *poVar4;
  undefined1 local_88 [8];
  FilePath output_file_path;
  long local_58;
  undefined1 local_48 [8];
  FilePath output_dir;
  
  pcVar1 = (output_file->_M_dataplus)._M_p;
  pathname = (string *)((long)&output_file_path.pathname_.field_2 + 8);
  output_file_path.pathname_.field_2._8_8_ = &stack0xffffffffffffffa8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pathname,pcVar1,pcVar1 + output_file->_M_string_length);
  FilePath::FilePath((FilePath *)local_88,pathname);
  if ((long *)output_file_path.pathname_.field_2._8_8_ != &stack0xffffffffffffffa8) {
    operator_delete((void *)output_file_path.pathname_.field_2._8_8_,local_58 + 1);
  }
  FilePath::RemoveFileName((FilePath *)local_48,(FilePath *)local_88);
  bVar2 = FilePath::CreateDirectoriesRecursively((FilePath *)local_48);
  if (bVar2) {
    pFVar3 = fopen((output_file->_M_dataplus)._M_p,"w");
    if (pFVar3 != (FILE *)0x0) goto LAB_0011b707;
  }
  GTestLog::GTestLog((GTestLog *)((long)&output_dir.pathname_.field_2 + 0xc),GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest.cc"
                     ,0xdf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Unable to open file \"",0x15);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(output_file->_M_dataplus)._M_p,
                      output_file->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
  GTestLog::~GTestLog((GTestLog *)((long)&output_dir.pathname_.field_2 + 0xc));
  pFVar3 = (FILE *)0x0;
LAB_0011b707:
  if (local_48 != (undefined1  [8])&output_dir.pathname_._M_string_length) {
    operator_delete((void *)local_48,output_dir.pathname_._M_string_length + 1);
  }
  if (local_88 != (undefined1  [8])&output_file_path.pathname_._M_string_length) {
    operator_delete((void *)local_88,output_file_path.pathname_._M_string_length + 1);
  }
  return (FILE *)pFVar3;
}

Assistant:

static FILE* OpenFileForWriting(const std::string& output_file) {
  FILE* fileout = nullptr;
  FilePath output_file_path(output_file);
  FilePath output_dir(output_file_path.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    fileout = posix::FOpen(output_file.c_str(), "w");
  }
  if (fileout == nullptr) {
    GTEST_LOG_(FATAL) << "Unable to open file \"" << output_file << "\"";
  }
  return fileout;
}